

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_filter.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  VectorXd *other;
  CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *pCVar1;
  ostream *poVar2;
  VectorXd measurement;
  DenseStorage<double,__1,__1,_1,_0> local_258;
  DenseStorage<double,__1,__1,_1,_0> local_248;
  VectorXd local_238;
  Scalar local_228;
  MatrixXd R;
  Scalar local_208 [2];
  MatrixXd local_1f8;
  MatrixXd local_1e0;
  MatrixXd local_1c8;
  MatrixXd local_1b0;
  Matrix2d Q;
  undefined8 local_178;
  undefined8 uStack_170;
  DenseStorage<double,__1,__1,__1,_0> local_160;
  KFilter filter;
  Matrix2d P;
  Matrix2d F;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_70;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_50;
  
  filter.F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)&F;
  filter.F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  filter.F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 1;
  filter.x_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x1;
  F.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[0] = 1.0;
  P.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[0] = 0.1;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)&filter,
                      (Scalar *)&P);
  Q.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[0] = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::operator_
                     (pCVar1,(Scalar *)&Q);
  R.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x3ff0000000000000;
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::operator_(pCVar1,(Scalar *)&R);
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::finished
            ((CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)&filter);
  local_178 = 0x4024000000000000;
  uStack_170 = 0x4012000000000000;
  filter.F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  filter.F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 1;
  filter.x_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x1;
  P.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[0] = 500.0;
  Q.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[0] = 0.0;
  filter.F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)&P;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)&filter,
                      (Scalar *)&Q);
  R.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::operator_
                     (pCVar1,(Scalar *)&R);
  local_208[0] = 49.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::operator_(pCVar1,local_208);
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::finished
            ((CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)&filter);
  local_208[0] = 1.0;
  local_208[1] = 0.0;
  filter.F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)
       CONCAT44(filter.F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                .m_data._4_4_,1);
  Q.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[0] =
       (double)CONCAT44(Q.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
                        m_data.array[0]._4_4_,1);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&R,(int *)&filter,(int *)&Q);
  filter.F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x3ff0000000000000;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::CommaInitializer
            (&local_50,(Matrix<double,__1,__1,_0,__1,__1> *)&R,(Scalar *)&filter);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::finished(&local_50);
  filter.F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  filter.F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 1;
  filter.x_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x1;
  Q.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[0] = 0.0;
  measurement.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  filter.F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)&Q;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)&filter,
                      (Scalar *)&measurement);
  local_258.m_data = (double *)0x0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::operator_
                     (pCVar1,(Scalar *)&local_258);
  local_228 = 0.1;
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::operator_(pCVar1,&local_228);
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::finished
            ((CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)&filter);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Matrix<double,2,2,0,2,2>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_1b0,
             (DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)&F);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_238,
             (DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)&local_178);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Matrix<double,2,2,0,2,2>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_1c8,
             (DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)&P);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Matrix<double,2,2,0,2,2>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_1e0,
             (DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)&Q);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Matrix<double,1,2,1,1,2>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_1f8,
             (DenseBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_> *)local_208);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            (&local_160,(DenseStorage<double,__1,__1,__1,_0> *)&R);
  KFilter::KFilter(&filter,&local_1b0,&local_238,&local_1c8,&local_1e0,&local_1f8,
                   (MatrixXd *)&local_160);
  free(local_160.m_data);
  free(local_1f8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(local_1e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(local_1c8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(local_238.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(local_1b0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  other = &filter.x_;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)&measurement,
             (DenseStorage<double,__1,__1,_1,_0> *)other);
  poVar2 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&measurement);
  std::endl<char,std::char_traits<char>>(poVar2);
  free(measurement.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  KFilter::predict(&filter);
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)&measurement,
             (DenseStorage<double,__1,__1,_1,_0> *)other);
  poVar2 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&measurement);
  std::endl<char,std::char_traits<char>>(poVar2);
  free(measurement.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  local_258.m_data = (double *)CONCAT44(local_258.m_data._4_4_,1);
  local_228 = (Scalar)CONCAT44(local_228._4_4_,1);
  Eigen::Matrix<double,-1,1,0,-1,1>::Matrix<int,int>
            ((Matrix<double,_1,1,0,_1,1> *)&measurement,(int *)&local_258,(int *)&local_228);
  local_258.m_data = (double *)0x402499999999999a;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::CommaInitializer
            (&local_70,&measurement,(Scalar *)&local_258);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::finished(&local_70);
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            (&local_248,(DenseStorage<double,__1,__1,_1,_0> *)&measurement);
  KFilter::update(&filter,(VectorXd *)&local_248);
  free(local_248.m_data);
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            (&local_258,(DenseStorage<double,__1,__1,_1,_0> *)other);
  poVar2 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_258);
  std::endl<char,std::char_traits<char>>(poVar2);
  free(local_258.m_data);
  free(measurement.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  KFilter::~KFilter(&filter);
  free(R.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  return 0;
}

Assistant:

int main(int argc, char const *argv[])
{
    Matrix2d F;
    F << 1, 0.1,
         0, 1;
    Vector2d x(10.0, 4.5);
    Matrix2d P;
    P << 500, 0,
         0,   49;
    RowVector2d H(1.0, 0.0);
    MatrixXd R(1, 1);
    R << 1;
    Matrix2d Q;
    Q << 0.0, 0.0,
         0.0, 0.1;

    KFilter filter(F, x, P, Q, H, R);
    std::cout << filter.x() << std::endl;
    filter.predict();
    std::cout << filter.x() << std::endl;
    Eigen::VectorXd measurement(1, 1);
    measurement << 10.3;
    filter.update(measurement);
    std::cout << filter.x() << std::endl;
    return 0;
}